

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O1

bool user_select_objs_replace_placeholder_proc
               (Am_Object *ph,Am_Value *new_value,Am_Object *sel_widget)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Value ok;
  Am_Object local_40;
  Am_Value local_38;
  
  pAVar2 = Am_Object::Get(ph,Am_PLACEHOLDER_INITIALIZED,0);
  bVar1 = Am_Value::Valid(pAVar2);
  if (bVar1) {
    pAVar2 = Am_Object::Get(ph,0x169,0);
    Am_Value::operator=(new_value,pAVar2);
    bVar1 = true;
  }
  else {
    local_38.type = 0;
    local_38.value.wrapper_value = (Am_Wrapper *)0x0;
    Am_Object::Set(ph,Am_PLACEHOLDER_INITIALIZED,true,0);
    Am_Object::Am_Object(&local_40,&am_askselectobj);
    Am_Pop_Up_Window_And_Wait(&local_40,&local_38,false);
    Am_Object::~Am_Object(&local_40);
    bVar1 = Am_Value::Valid(&local_38);
    if (bVar1) {
      pAVar2 = Am_Object::Get(sel_widget,0x169,0);
      Am_Value::operator=(new_value,pAVar2);
      if (am_sdebug == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"for placeholder ",0x10);
        poVar3 = operator<<((ostream *)&std::cout,ph);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," setting value to ",0x12);
        poVar3 = operator<<(poVar3,new_value);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        std::ostream::flush();
      }
      Am_Object::Set(ph,0x169,new_value,0);
    }
    Am_Value::~Am_Value(&local_38);
  }
  return bVar1;
}

Assistant:

Am_Define_Method(Am_Placeholder_Replace_Method, bool,
                 user_select_objs_replace_placeholder,
                 (Am_Object & ph, Am_Value &new_value, Am_Object &sel_widget))
{
  if (ph.Get(Am_PLACEHOLDER_INITIALIZED).Valid()) {
    new_value = ph.Get(Am_VALUE);
    return true;
  } else {
    Am_Value ok;
    ph.Set(Am_PLACEHOLDER_INITIALIZED, true);
    Am_Pop_Up_Window_And_Wait(am_askselectobj, ok, false);
    if (ok.Valid()) {
      new_value = sel_widget.Get(Am_VALUE);
      if (am_sdebug)
        std::cout << "for placeholder " << ph << " setting value to "
                  << new_value << std::endl
                  << std::flush;
      ph.Set(Am_VALUE, new_value);
      return true;
    } else
      return false;
  }
}